

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js.h
# Opt level: O2

bool __thiscall wasm::ABI::wasm2js::isHelper(wasm2js *this,IString name)

{
  size_t sVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  int iVar6;
  int iVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  
  sVar1 = name.str._M_len;
  iVar6 = (int)name.str._M_len;
  iVar7 = name.str._M_len._4_4_;
  auVar9._0_4_ = -(uint)((int)_visitCall == iVar6);
  auVar9._4_4_ = -(uint)((int)((ulong)_visitCall >> 0x20) == iVar7);
  auVar9._8_4_ = -(uint)((int)_finalize == iVar6);
  auVar9._12_4_ = -(uint)((int)((ulong)_finalize >> 0x20) == iVar7);
  auVar12._4_4_ = auVar9._0_4_;
  auVar12._0_4_ = auVar9._4_4_;
  auVar12._8_4_ = auVar9._12_4_;
  auVar12._12_4_ = auVar9._8_4_;
  auVar11._0_4_ = -(uint)((int)_finalize == iVar6);
  auVar11._4_4_ = -(uint)((int)((ulong)_finalize >> 0x20) == iVar7);
  auVar11._8_4_ = -(uint)((int)UINT16ARRAY == iVar6);
  auVar11._12_4_ = -(uint)((int)((ulong)UINT16ARRAY >> 0x20) == iVar7);
  auVar10._4_4_ = auVar11._0_4_;
  auVar10._0_4_ = auVar11._4_4_;
  auVar10._8_4_ = auVar11._12_4_;
  auVar10._12_4_ = auVar11._8_4_;
  auVar11 = packssdw(auVar10 & auVar11,auVar12 & auVar9);
  auVar3._0_4_ = -(uint)((int)_parseExpression == iVar6);
  auVar3._4_4_ = -(uint)((int)((ulong)_parseExpression >> 0x20) == iVar7);
  auVar3._8_4_ = -(uint)((int)_visitSIMDShift == iVar6);
  auVar3._12_4_ = -(uint)((int)((ulong)_visitSIMDShift >> 0x20) == iVar7);
  auVar8._4_4_ = auVar3._0_4_;
  auVar8._0_4_ = auVar3._4_4_;
  auVar8._8_4_ = auVar3._12_4_;
  auVar8._12_4_ = auVar3._8_4_;
  auVar5._0_4_ = -(uint)((int)_finalize == iVar6);
  auVar5._4_4_ = -(uint)((int)((ulong)_finalize >> 0x20) == iVar7);
  auVar5._8_4_ = -(uint)((int)SCRATCH_LOAD_F64 == iVar6);
  auVar5._12_4_ = -(uint)((int)((ulong)SCRATCH_LOAD_F64 >> 0x20) == iVar7);
  auVar4._4_4_ = auVar5._0_4_;
  auVar4._0_4_ = auVar5._4_4_;
  auVar4._8_4_ = auVar5._12_4_;
  auVar4._12_4_ = auVar5._8_4_;
  auVar5 = packssdw(auVar4 & auVar5,auVar8 & auVar3);
  auVar5 = packssdw(auVar5,auVar11);
  bVar2 = true;
  if (((((((((((auVar5 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
              (auVar5 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar5 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar5 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar5 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar5 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
         (auVar5 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar5[0xf]) &&
       (_append != sVar1)) && (cashew::SET != sVar1)) &&
     (((_visitRefTest != sVar1 && (_endl<char,std::char_traits<char>> != sVar1)) &&
      (_finalize != sVar1)))) {
    bVar2 = __M_create == sVar1;
  }
  return bVar2;
}

Assistant:

inline bool isHelper(IString name) {
  return name == SCRATCH_LOAD_I32 || name == SCRATCH_STORE_I32 ||
         name == SCRATCH_LOAD_F32 || name == SCRATCH_STORE_F32 ||
         name == SCRATCH_LOAD_F64 || name == SCRATCH_STORE_F64 ||
         name == ATOMIC_WAIT_I32 || name == MEMORY_INIT ||
         name == MEMORY_FILL || name == MEMORY_COPY || name == DATA_DROP ||
         name == ATOMIC_RMW_I64 || name == GET_STASHED_BITS || name == TRAP;
}